

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO1Segment<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          FeLagrangeO1Segment<double> *this,MatrixXd *refcoords)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong cols;
  long lVar3;
  long lVar4;
  variable_if_dynamic<long,__1> vVar5;
  double *pdVar6;
  double *pdVar7;
  stringstream ss;
  string local_220;
  string local_200;
  undefined1 local_1e0 [32];
  RhsNested local_1c0;
  double local_1b0;
  undefined1 local_1a8 [16];
  variable_if_dynamic<long,__1> local_198;
  XprTypeNested local_190;
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      == 1) {
    cols = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,2,cols);
    local_1a8._0_8_ = &DAT_3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                      *)&local_220,1,cols & 0xffffffff,(scalar_constant_op<double> *)local_1a8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     *)local_1e0,(Lhs *)&local_220,refcoords,
                    (scalar_difference_op<double,_double> *)local_1a8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               __return_storage_ptr__,0);
    local_1b0 = (double)local_1e0._24_8_;
    pdVar7 = (local_1c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_data;
    lVar3 = (local_1c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_1e0,(assign_op<double,_double> *)&local_200);
    if (0 < local_198.m_value) {
      lVar4 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      vVar5.m_value = local_198.m_value;
      pdVar6 = (double *)local_1a8._0_8_;
      do {
        *pdVar6 = local_1b0 - *pdVar7;
        pdVar7 = pdVar7 + lVar3;
        pdVar6 = pdVar6 + lVar4;
        vVar5.m_value = vVar5.m_value + -1;
      } while (vVar5.m_value != 0);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               __return_storage_ptr__,1);
    pdVar7 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_data;
    lVar3 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,refcoords,
               (assign_op<double,_double> *)local_1e0);
    if (0 < local_198.m_value) {
      lVar4 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      do {
        *(double *)local_1a8._0_8_ = *pdVar7;
        pdVar7 = pdVar7 + lVar3;
        local_1a8._0_8_ = local_1a8._0_8_ + lVar4 * 8;
        local_198.m_value = local_198.m_value + -1;
      } while (local_198.m_value != 0);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Reference coordinates must be 1-vectors",0x27);
  pcVar1 = local_1e0 + 0x10;
  local_1e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"refcoords.rows() == 1","");
  paVar2 = &local_220.field_2;
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_1e0,&local_220,0x14b,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1e0._0_8_ != pcVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  local_1e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"false","");
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  base::AssertionFailed((string *)local_1e0,&local_220,0x14b,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)local_1e0);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 1,
                  "Reference coordinates must be 1-vectors");
    const size_type n_pts(refcoords.cols());

    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(
        2, refcoords.cols());
    result.row(0) = Eigen::RowVectorXd::Constant(1, n_pts, 1.0) - refcoords;
    result.row(1) = refcoords;

    return result;
  }